

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

int factors(int M,int *arr)

{
  int iVar1;
  int iVar2;
  int m2;
  int m1;
  int mult;
  int num;
  int N;
  int i;
  int *arr_local;
  int M_local;
  
  num = 0;
  mult = M;
  while (mult % 0x35 == 0) {
    mult = mult / 0x35;
    arr[num] = 0x35;
    num = num + 1;
  }
  while (mult % 0x2f == 0) {
    mult = mult / 0x2f;
    arr[num] = 0x2f;
    num = num + 1;
  }
  while (mult % 0x2b == 0) {
    mult = mult / 0x2b;
    arr[num] = 0x2b;
    num = num + 1;
  }
  while (mult % 0x29 == 0) {
    mult = mult / 0x29;
    arr[num] = 0x29;
    num = num + 1;
  }
  while (mult % 0x25 == 0) {
    mult = mult / 0x25;
    arr[num] = 0x25;
    num = num + 1;
  }
  while (mult % 0x1f == 0) {
    mult = mult / 0x1f;
    arr[num] = 0x1f;
    num = num + 1;
  }
  while (mult % 0x1d == 0) {
    mult = mult / 0x1d;
    arr[num] = 0x1d;
    num = num + 1;
  }
  while (mult % 0x17 == 0) {
    mult = mult / 0x17;
    arr[num] = 0x17;
    num = num + 1;
  }
  while (mult % 0x13 == 0) {
    mult = mult / 0x13;
    arr[num] = 0x13;
    num = num + 1;
  }
  while (mult % 0x11 == 0) {
    mult = mult / 0x11;
    arr[num] = 0x11;
    num = num + 1;
  }
  while (mult % 0xd == 0) {
    mult = mult / 0xd;
    arr[num] = 0xd;
    num = num + 1;
  }
  while (mult % 0xb == 0) {
    mult = mult / 0xb;
    arr[num] = 0xb;
    num = num + 1;
  }
  while (mult % 8 == 0) {
    mult = mult / 8;
    arr[num] = 8;
    num = num + 1;
  }
  while (mult % 7 == 0) {
    mult = mult / 7;
    arr[num] = 7;
    num = num + 1;
  }
  while (mult % 5 == 0) {
    mult = mult / 5;
    arr[num] = 5;
    num = num + 1;
  }
  while (mult % 4 == 0) {
    mult = mult / 4;
    arr[num] = 4;
    num = num + 1;
  }
  while (mult % 3 == 0) {
    mult = mult / 3;
    arr[num] = 3;
    num = num + 1;
  }
  while (mult % 2 == 0) {
    mult = mult / 2;
    arr[num] = 2;
    num = num + 1;
  }
  if (0x1f < mult) {
    m1 = 2;
    while (1 < mult) {
      iVar1 = m1 * 6 + -1;
      iVar2 = m1 * 6 + 1;
      for (; mult % iVar1 == 0; mult = mult / iVar1) {
        arr[num] = iVar1;
        num = num + 1;
      }
      for (; mult % iVar2 == 0; mult = mult / iVar2) {
        arr[num] = iVar2;
        num = num + 1;
      }
      m1 = m1 + 1;
    }
  }
  return num;
}

Assistant:

int factors(int M, int* arr) {
	int i,N,num,mult,m1,m2;
	i = 0;
	N = M;
	while (N%53 == 0) {
		N = N/53;
		arr[i] = 53;
		i++;
	}
	while (N%47 == 0) {
		N = N/47;
		arr[i] = 47;
		i++;
	}
	while (N%43 == 0) {
		N = N/43;
		arr[i] = 43;
		i++;
	}
	while (N%41 == 0) {
		N = N/41;
		arr[i] = 41;
		i++;
	}
	while (N%37 == 0) {
		N = N/37;
		arr[i] = 37;
		i++;
	}
	while (N%31 == 0) {
		N = N/31;
		arr[i] = 31;
		i++;
	}
	while (N%29 == 0) {
		N = N/29;
		arr[i] = 29;
		i++;
	}
	while (N%23 == 0) {
		N = N/23;
		arr[i] = 23;
		i++;
	}
	while (N%19 == 0) {
		N = N/19;
		arr[i] = 19;
		i++;
	}
	while (N%17 == 0) {
		N = N/17;
		arr[i] = 17;
		i++;
	}
	while (N%13 == 0) {
		N = N/13;
		arr[i] = 13;
		i++;
	}
	while (N%11 == 0) {
		N = N/11;
		arr[i] = 11;
		i++;
	}
	while (N%8 == 0) {
		N = N/8;
		arr[i] = 8;
		i++;
	}
	while (N%7 == 0) {
		N = N/7;
		arr[i] = 7;
		i++;
	}
	while (N%5 == 0) {
		N = N/5;
		arr[i] = 5;
		i++;
	}
	while (N%4 == 0) {
		N = N/4;
		arr[i] = 4;
		i++;
	}
	while (N%3 == 0) {
		N = N/3;
		arr[i] = 3;
		i++;
	}
	while (N%2 == 0) {
		N = N/2;
		arr[i] = 2;
		i++;
	}
	if (N > 31) {
		num = 2;

		while (N > 1) {
			mult = num*6;
			m1 = mult-1;
			m2 = mult+1;
			while (N%m1 == 0 ) {
				arr[i] = m1;
				i++;
				N = N / m1;
			}
			while (N%m2 == 0 ) {
				arr[i] = m2;
				i++;
				N = N / m2;
			}
			num+=1;

		}
	}
	return i;

}